

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_clear(nk_context *ctx)

{
  byte *pbVar1;
  nk_size *pnVar2;
  nk_command_buffer *__s;
  undefined8 *puVar3;
  nk_size nVar4;
  nk_window *pnVar5;
  nk_page_element *pnVar6;
  nk_table *pnVar7;
  nk_page_element *elem;
  nk_size nVar8;
  nk_page_element *pnVar9;
  size_t __n;
  size_t __n_00;
  ulong __n_01;
  nk_window *win;
  nk_page_data *pd;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3a81,"void nk_clear(struct nk_context *)");
  }
  if (ctx->use_pool == 0) {
    nVar4 = (ctx->memory).marker[0].offset;
    pnVar2 = &(ctx->memory).needed;
    *pnVar2 = *pnVar2 + (nVar4 - (ctx->memory).allocated);
    nVar8 = 0;
    if ((ctx->memory).marker[0].active != 0) {
      nVar8 = nVar4;
    }
    (ctx->memory).allocated = nVar8;
    (ctx->memory).marker[0].active = 0;
  }
  else {
    (ctx->memory).allocated = 0;
    (ctx->memory).needed = 0;
    (ctx->memory).size = (ctx->memory).memory.size;
  }
  ctx->build = 0;
  (ctx->memory).calls = 0;
  ctx->last_widget_state = 0;
  (ctx->style).cursor_active = (ctx->style).cursors[0];
  __s = &ctx->overlay;
  __n_01 = (ulong)__s & 3;
  if (__n_01 == 0) {
    (ctx->overlay).end = 0;
    (ctx->overlay).last = 0;
    (ctx->overlay).userdata.ptr = (void *)0x0;
    (ctx->overlay).begin = 0;
    (ctx->overlay).clip.w = 0.0;
    (ctx->overlay).clip.h = 0.0;
    *(undefined8 *)&(ctx->overlay).use_clipping = 0;
    __s->base = (nk_buffer *)0x0;
    (ctx->overlay).clip.x = 0.0;
    (ctx->overlay).clip.y = 0.0;
  }
  else {
    memset(__s,0,4 - __n_01);
    puVar3 = (undefined8 *)((long)__s + (4 - __n_01));
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3[2] = 0;
    puVar3[3] = 0;
    puVar3[4] = 0;
    puVar3[5] = 0;
    *(undefined8 *)((long)puVar3 + 0x2c) = 0;
    *(undefined8 *)((long)puVar3 + 0x34) = 0;
    memset((void *)((long)puVar3 + 0x3c),0,__n_01);
  }
  win = ctx->begin;
  do {
    while( true ) {
      if (win == (nk_window *)0x0) {
        ctx->seq = ctx->seq + 1;
        return;
      }
      if (((win->flags & 0xc000) != 0x8000) || (win->seq != ctx->seq)) break;
LAB_0012b309:
      win = win->next;
    }
    if (((win->flags & 0x6000) != 0) && (win == ctx->active)) {
      pnVar5 = win->prev;
      ctx->active = pnVar5;
      ctx->end = pnVar5;
      if (pnVar5 == (nk_window *)0x0) {
        ctx->begin = (nk_window *)0x0;
      }
      else {
        pbVar1 = (byte *)((long)&pnVar5->flags + 1);
        *pbVar1 = *pbVar1 & 0xef;
      }
    }
    pnVar5 = (win->popup).win;
    if ((pnVar5 != (nk_window *)0x0) && (pnVar5->seq != ctx->seq)) {
      nk_free_window(ctx,pnVar5);
      (win->popup).win = (nk_window *)0x0;
    }
    pnVar6 = (nk_page_element *)win->tables;
    pnVar9 = (nk_page_element *)win->tables;
    while (elem = pnVar6, elem != (nk_page_element *)0x0) {
      pnVar6 = (nk_page_element *)(elem->data).tbl.next;
      if ((elem->data).tbl.seq != ctx->seq) {
        if (pnVar9 == elem) {
          win->tables = (nk_table *)pnVar6;
        }
        pnVar7 = (elem->data).tbl.prev;
        if (pnVar6 != (nk_page_element *)0x0) {
          (pnVar6->data).tbl.prev = pnVar7;
        }
        if (pnVar7 != (nk_table *)0x0) {
          pnVar7->next = (nk_table *)pnVar6;
        }
        (elem->data).tbl.next = (nk_table *)0x0;
        (elem->data).tbl.prev = (nk_table *)0x0;
        __n = (ulong)elem & 3;
        if (__n == 0) {
          __n = 0x1f0;
          pnVar9 = elem;
        }
        else {
          __n_00 = -__n + 4;
          memset(elem,0,__n_00);
          memset((void *)((long)elem + __n_00),0,0x1ec);
          pnVar9 = (nk_page_element *)((long)elem + -__n + 0x1f0);
        }
        memset(pnVar9,0,__n);
        nk_free_page_element(ctx,elem);
        pnVar9 = (nk_page_element *)win->tables;
        if (elem == (nk_page_element *)win->tables) {
          win->tables = (nk_table *)pnVar6;
          pnVar9 = pnVar6;
        }
      }
    }
    if ((win->seq == ctx->seq) && ((win->flags & 0x4000) == 0)) goto LAB_0012b309;
    pnVar5 = win->next;
    nk_remove_window(ctx,win);
    nk_free_window(ctx,win);
    win = pnVar5;
  } while( true );
}

Assistant:

NK_API void
nk_clear(struct nk_context *ctx)
{
    struct nk_window *iter;
    struct nk_window *next;
    NK_ASSERT(ctx);

    if (!ctx) return;
    if (ctx->use_pool)
        nk_buffer_clear(&ctx->memory);
    else nk_buffer_reset(&ctx->memory, NK_BUFFER_FRONT);

    ctx->build = 0;
    ctx->memory.calls = 0;
    ctx->last_widget_state = 0;
    ctx->style.cursor_active = ctx->style.cursors[NK_CURSOR_ARROW];
    NK_MEMSET(&ctx->overlay, 0, sizeof(ctx->overlay));

    /* garbage collector */
    iter = ctx->begin;
    while (iter) {
        /* make sure valid minimized windows do not get removed */
        if ((iter->flags & NK_WINDOW_MINIMIZED) &&
            !(iter->flags & NK_WINDOW_CLOSED) &&
            iter->seq == ctx->seq) {
            iter = iter->next;
            continue;
        }
        /* remove hotness from hidden or closed windows*/
        if (((iter->flags & NK_WINDOW_HIDDEN) ||
            (iter->flags & NK_WINDOW_CLOSED)) &&
            iter == ctx->active) {
            ctx->active = iter->prev;
            ctx->end = iter->prev;
            if (!ctx->end)
                ctx->begin = 0;
            if (ctx->active)
                ctx->active->flags &= ~(unsigned)NK_WINDOW_ROM;
        }
        /* free unused popup windows */
        if (iter->popup.win && iter->popup.win->seq != ctx->seq) {
            nk_free_window(ctx, iter->popup.win);
            iter->popup.win = 0;
        }
        /* remove unused window state tables */
        {struct nk_table *n, *it = iter->tables;
        while (it) {
            n = it->next;
            if (it->seq != ctx->seq) {
                nk_remove_table(iter, it);
                nk_zero(it, sizeof(union nk_page_data));
                nk_free_table(ctx, it);
                if (it == iter->tables)
                    iter->tables = n;
            } it = n;
        }}
        /* window itself is not used anymore so free */
        if (iter->seq != ctx->seq || iter->flags & NK_WINDOW_CLOSED) {
            next = iter->next;
            nk_remove_window(ctx, iter);
            nk_free_window(ctx, iter);
            iter = next;
        } else iter = iter->next;
    }
    ctx->seq++;
}